

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsInt __thiscall
HEkk::addBadBasisChange
          (HEkk *this,HighsInt row_out,HighsInt variable_out,HighsInt variable_in,
          BadBasisChangeReason reason,bool taboo)

{
  pointer pHVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  HighsSimplexBadBasisChangeRecord record;
  
  pHVar1 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->bad_basis_change_).
                        super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) >> 5;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = 0;
  }
  uVar3 = 0xffffffff;
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if (uVar5 * 0x20 == uVar6) {
      uVar3 = 0xffffffff;
      break;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
    uVar4 = uVar6 + 0x20;
  } while ((((*(int *)((long)&pHVar1->row_out + uVar6) != row_out) ||
            (*(int *)((long)&pHVar1->variable_out + uVar6) != variable_out)) ||
           (*(int *)((long)&pHVar1->variable_in + uVar6) != variable_in)) ||
          (*(BadBasisChangeReason *)((long)&pHVar1->reason + uVar6) != reason));
  iVar2 = (int)uVar3;
  if (iVar2 < 0) {
    record.taboo = taboo;
    record.row_out = row_out;
    record.variable_out = variable_out;
    record.variable_in = variable_in;
    record.reason = reason;
    std::vector<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
    ::push_back(&this->bad_basis_change_,&record);
    iVar2 = (int)((ulong)((long)(this->bad_basis_change_).
                                super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->bad_basis_change_).
                               super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
  }
  else {
    pHVar1[uVar3].taboo = taboo;
  }
  return iVar2;
}

Assistant:

HighsInt HEkk::addBadBasisChange(const HighsInt row_out,
                                 const HighsInt variable_out,
                                 const HighsInt variable_in,
                                 const BadBasisChangeReason reason,
                                 const bool taboo) {
  assert(0 <= row_out && row_out <= lp_.num_row_);
  assert(0 <= variable_out && variable_out <= lp_.num_col_ + lp_.num_row_);
  if (variable_in >= 0) {
    assert(0 <= variable_in && variable_in <= lp_.num_col_ + lp_.num_row_);
  } else {
    assert(variable_in == -1);
  }
  // Check that this is not already on the list
  const HighsInt num_bad_basis_change = bad_basis_change_.size();
  HighsInt bad_basis_change_num = -1;
  for (HighsInt Ix = 0; Ix < num_bad_basis_change; Ix++) {
    HighsSimplexBadBasisChangeRecord& record = bad_basis_change_[Ix];
    if (record.row_out == row_out && record.variable_out == variable_out &&
        record.variable_in == variable_in && record.reason == reason) {
      bad_basis_change_num = Ix;
      break;
    }
  }
  if (bad_basis_change_num < 0) {
    // Not on the list so create record
    HighsSimplexBadBasisChangeRecord record;
    record.taboo = taboo;
    record.row_out = row_out;
    record.variable_out = variable_out;
    record.variable_in = variable_in;
    record.reason = reason;
    bad_basis_change_.push_back(record);
    bad_basis_change_num = bad_basis_change_.size() - 1;
  } else {
    // On the list so just update whether it is taboo
    bad_basis_change_[bad_basis_change_num].taboo = taboo;
  }
  return bad_basis_change_num;
}